

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void FindFollowSets(lemon *lemp)

{
  int iVar1;
  state **ppsVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  config *pcVar8;
  plink *ppVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = lemp->nstate;
  if (0 < (long)iVar1) {
    ppsVar2 = lemp->sorted;
    lVar7 = 0;
    do {
      for (pcVar8 = ppsVar2[lVar7]->cfp; pcVar8 != (config *)0x0; pcVar8 = pcVar8->next) {
        pcVar8->status = INCOMPLETE;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  do {
    if (lemp->nstate < 1) {
      return;
    }
    lVar7 = 0;
    bVar6 = false;
    do {
      for (pcVar8 = lemp->sorted[lVar7]->cfp; pcVar8 != (config *)0x0; pcVar8 = pcVar8->next) {
        if (pcVar8->status != COMPLETE) {
          for (ppVar9 = pcVar8->fplp; ppVar9 != (plink *)0x0; ppVar9 = ppVar9->next) {
            lVar10 = (long)size;
            if (0 < lVar10) {
              pcVar3 = ppVar9->cfp->fws;
              pcVar4 = pcVar8->fws;
              lVar11 = 0;
              bVar5 = false;
              do {
                if ((pcVar4[lVar11] != '\0') && (pcVar3[lVar11] == '\0')) {
                  pcVar3[lVar11] = '\x01';
                  bVar5 = true;
                }
                lVar11 = lVar11 + 1;
              } while (lVar10 != lVar11);
              if (bVar5) {
                ppVar9->cfp->status = INCOMPLETE;
                bVar6 = true;
              }
            }
          }
          pcVar8->status = COMPLETE;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < lemp->nstate);
  } while (bVar6);
  return;
}

Assistant:

void FindFollowSets(struct lemon *lemp)
{
  int i;
  struct config *cfp;
  struct plink *plp;
  int progress;
  int change;

  for(i=0; i<lemp->nstate; i++){
    for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
      cfp->status = INCOMPLETE;
    }
  }
  
  do{
    progress = 0;
    for(i=0; i<lemp->nstate; i++){
      for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
        if( cfp->status==COMPLETE ) continue;
        for(plp=cfp->fplp; plp; plp=plp->next){
          change = SetUnion(plp->cfp->fws,cfp->fws);
          if( change ){
            plp->cfp->status = INCOMPLETE;
            progress = 1;
	  }
	}
        cfp->status = COMPLETE;
      }
    }
  }while( progress );
}